

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.hpp
# Opt level: O0

string_t duckdb::StringParquetValueConversion::PlainRead<true>
                   (ByteBuffer *plain_data,ColumnReader *reader)

{
  uint uVar1;
  uint32_t len;
  StringColumnReader *data;
  ByteBuffer *this;
  char *str_data;
  string_t *in_RSI;
  undefined8 *in_RDI;
  ColumnReader *unaff_retaddr;
  char *plain_str;
  uint32_t str_len;
  StringColumnReader *scr;
  string_t ret_str;
  uint64_t in_stack_ffffffffffffffb8;
  ByteBuffer *in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  anon_union_16_2_67f50693_for_value local_10;
  
  data = ColumnReader::Cast<duckdb::StringColumnReader>(unaff_retaddr);
  if (data->fixed_width_string_length == 0) {
    uVar1 = ByteBuffer::read<unsigned_int>(in_stack_ffffffffffffffc0);
    this = (ByteBuffer *)(ulong)uVar1;
  }
  else {
    this = (ByteBuffer *)data->fixed_width_string_length;
  }
  len = (uint32_t)this;
  ByteBuffer::available
            ((ByteBuffer *)CONCAT44(len,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  str_data = char_ptr_cast<unsigned_char>((uchar *)*in_RDI);
  StringColumnReader::VerifyString
            ((StringColumnReader *)CONCAT44(len,in_stack_ffffffffffffffd0),str_data,
             (uint32_t)((ulong)this >> 0x20));
  string_t::string_t(in_RSI,(char *)data,len);
  ByteBuffer::inc(this,in_stack_ffffffffffffffb8);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static string_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &scr = reader.Cast<StringColumnReader>();
		uint32_t str_len =
		    scr.fixed_width_string_length == 0 ? plain_data.read<uint32_t>() : scr.fixed_width_string_length;
		plain_data.available(str_len);
		auto plain_str = char_ptr_cast(plain_data.ptr);
		scr.VerifyString(plain_str, str_len);
		auto ret_str = string_t(plain_str, str_len);
		plain_data.inc(str_len);
		return ret_str;
	}